

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Vec_Int_t * Vta_ManCollectNodes(Vta_Man_t *p,int f)

{
  int iVar1;
  Vec_Int_t *vOrder;
  Gia_Man_t *pGVar2;
  Vta_Obj_t *pVVar3;
  uint uVar4;
  int iVar5;
  
  vOrder = p->vOrder;
  vOrder->nSize = 0;
  pGVar2 = p->pGia;
  iVar5 = pGVar2->vCos->nSize;
  if (iVar5 <= pGVar2->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar5 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = *pGVar2->vCos->pArray;
  if (((long)iVar5 < 0) || (pGVar2->nObjs <= iVar5)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  iVar5 = iVar5 - (*(uint *)(pGVar2->pObjs + iVar5) & 0x1fffffff);
  uVar4 = p->pBins[(int)((uint)((iVar5 + f + 1) * (iVar5 + f)) % (uint)p->nBins)];
  if ((-1 < (int)uVar4) && (iVar1 = p->nObjs, (int)uVar4 < iVar1)) {
    if (uVar4 != 0) {
      pVVar3 = p->pObjs;
      do {
        if ((pVVar3[uVar4].iObj == iVar5) && (pVVar3[uVar4].iFrame == f)) {
          if ((int)uVar4 < iVar1) {
            if (*(int *)&pVVar3[uVar4].field_0xc < 0) {
              __assert_fail("!pThis->fVisit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x1ef,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
            }
            Vta_ManCollectNodes_rec(p,pVVar3 + uVar4,vOrder);
            if (*(int *)&pVVar3[uVar4].field_0xc < 0) {
              return p->vOrder;
            }
            __assert_fail("pThis->fVisit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x1f1,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
          }
          goto LAB_00623c2e;
        }
        uVar4 = pVVar3[uVar4].iNext;
        if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) goto LAB_00623c2e;
      } while (uVar4 != 0);
      if (iVar1 < 1) goto LAB_00623c2e;
    }
    __assert_fail("pThis != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x1ee,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
  }
LAB_00623c2e:
  __assert_fail("i >= 0 && i < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
}

Assistant:

Vec_Int_t * Vta_ManCollectNodes( Vta_Man_t * p, int f )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    Vec_IntClear( p->vOrder );
    pObj = Gia_ManPo( p->pGia, 0 );
    pThis = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), f );
    assert( pThis != NULL );
    assert( !pThis->fVisit );
    Vta_ManCollectNodes_rec( p, pThis, p->vOrder );
    assert( pThis->fVisit );
    return p->vOrder;
}